

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O0

bool __thiscall
cmFileInstaller::Parse
          (cmFileInstaller *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmCommand *pcVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileInstaller *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = cmFileCopier::Parse(&this->super_cmFileCopier,args);
  if (!bVar2) {
    return false;
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar1 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,
                 "INSTALL option RENAME may not be combined with FILES_FROM_DIR.",&local_41);
      cmCommand::SetError(pcVar1,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      return false;
    }
    if ((*(int *)&(this->super_cmFileCopier).field_0xf4 != 4) &&
       (*(int *)&(this->super_cmFileCopier).field_0xf4 != 5)) {
      pcVar1 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,
                 "INSTALL option RENAME may be used only with FILES or PROGRAMS.",&local_79);
      cmCommand::SetError(pcVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      return false;
    }
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_cmFileCopier).Files);
    if (1 < sVar4) {
      pcVar1 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"INSTALL option RENAME may be used only with one file.",
                 &local_a1);
      cmCommand::SetError(pcVar1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
      return false;
    }
  }
  bVar2 = HandleInstallDestination(this);
  if (bVar2) {
    if ((byte)(((this->MessageAlways & 1U) != 0) + ((this->MessageLazy & 1U) != 0) +
              ((this->MessageNever & 1U) != 0)) < 2) {
      this_local._7_1_ = true;
    }
    else {
      pcVar1 = &((this->super_cmFileCopier).FileCommand)->super_cmCommand;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,
                 "INSTALL options MESSAGE_ALWAYS, MESSAGE_LAZY, and MESSAGE_NEVER are mutually exclusive."
                 ,&local_c9);
      cmCommand::SetError(pcVar1,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileInstaller::Parse(std::vector<std::string> const& args)
{
  if (!this->cmFileCopier::Parse(args)) {
    return false;
  }

  if (!this->Rename.empty()) {
    if (!this->FilesFromDir.empty()) {
      this->FileCommand->SetError("INSTALL option RENAME may not be "
                                  "combined with FILES_FROM_DIR.");
      return false;
    }
    if (this->InstallType != cmInstallType_FILES &&
        this->InstallType != cmInstallType_PROGRAMS) {
      this->FileCommand->SetError("INSTALL option RENAME may be used "
                                  "only with FILES or PROGRAMS.");
      return false;
    }
    if (this->Files.size() > 1) {
      this->FileCommand->SetError("INSTALL option RENAME may be used "
                                  "only with one file.");
      return false;
    }
  }

  if (!this->HandleInstallDestination()) {
    return false;
  }

  if (((this->MessageAlways ? 1 : 0) + (this->MessageLazy ? 1 : 0) +
       (this->MessageNever ? 1 : 0)) > 1) {
    this->FileCommand->SetError("INSTALL options MESSAGE_ALWAYS, "
                                "MESSAGE_LAZY, and MESSAGE_NEVER "
                                "are mutually exclusive.");
    return false;
  }

  return true;
}